

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

CallbackFederate * getCallbackFed(HelicsFederate fed,HelicsError *err)

{
  int *piVar1;
  CallbackFederate *pCVar2;
  bool bVar3;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (fed == (HelicsFederate)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_0019fdb5;
    }
    else {
      bVar3 = *(int *)((long)fed + 8) == 0x2352188;
      piVar1 = (int *)0x0;
      if (bVar3) {
        piVar1 = (int *)fed;
      }
      if (bVar3 || err == (HelicsError *)0x0) goto LAB_0019fdb7;
    }
    err->error_code = -3;
    err->message = "federate object is not valid";
  }
LAB_0019fdb5:
  piVar1 = (int *)0x0;
LAB_0019fdb7:
  if (piVar1 != (int *)0x0) {
    if (*piVar1 == 4) {
      if (*(long *)(piVar1 + 4) == 0) {
        pCVar2 = (CallbackFederate *)0x0;
      }
      else {
        pCVar2 = (CallbackFederate *)
                 __dynamic_cast(*(long *)(piVar1 + 4),&helics::Federate::typeinfo,
                                &helics::CallbackFederate::typeinfo,0xffffffffffffffff);
      }
      if (err == (HelicsError *)0x0) {
        return pCVar2;
      }
      if (pCVar2 != (CallbackFederate *)0x0) {
        return pCVar2;
      }
    }
    else if (err == (HelicsError *)0x0) {
      return (CallbackFederate *)0x0;
    }
    err->error_code = -3;
    err->message = "Federate must be a callback federate";
  }
  return (CallbackFederate *)0x0;
}

Assistant:

helics::CallbackFederate* getCallbackFed(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if (fedObj->type == helics::FederateType::CALLBACK) {
        auto* rval = dynamic_cast<helics::CallbackFederate*>(fedObj->fedptr.get());
        if (rval != nullptr) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notCallbackFedString);
    return nullptr;
}